

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neon_helper.c
# Opt level: O0

uint64_t helper_neon_qrshl_u64_aarch64(CPUARMState_conflict *env,uint64_t val,uint64_t shiftop)

{
  byte bVar1;
  ulong uVar2;
  uint64_t tmp;
  int8_t shift;
  uint64_t shiftop_local;
  uint64_t val_local;
  CPUARMState_conflict *env_local;
  
  bVar1 = (byte)shiftop;
  if ((char)bVar1 < '@') {
    if ((char)bVar1 < -0x40) {
      shiftop_local = 0;
    }
    else if (bVar1 == 0xc0) {
      shiftop_local = val >> 0x3f;
    }
    else if ((char)bVar1 < '\0') {
      uVar2 = val >> (0xff - bVar1 & 0x3f);
      if (uVar2 == 0xffffffffffffffff) {
        shiftop_local = 0x8000000000000000;
      }
      else {
        shiftop_local = uVar2 + 1 >> 1;
      }
    }
    else {
      shiftop_local = val << (bVar1 & 0x3f);
      if (shiftop_local >> (bVar1 & 0x3f) != val) {
        (env->vfp).qc[0] = 1;
        shiftop_local = 0xffffffffffffffff;
      }
    }
  }
  else {
    shiftop_local = val;
    if (val != 0) {
      (env->vfp).qc[0] = 1;
      shiftop_local = 0xffffffffffffffff;
    }
  }
  return shiftop_local;
}

Assistant:

uint64_t HELPER(neon_qrshl_u64)(CPUARMState *env, uint64_t val, uint64_t shiftop)
{
    int8_t shift = (int8_t)shiftop;
    if (shift >= 64) {
        if (val) {
            SET_QC();
            val = ~0;
        }
    } else if (shift < -64) {
        val = 0;
    } else if (shift == -64) {
        val >>= 63;
    } else if (shift < 0) {
        val >>= (-shift - 1);
        if (val == UINT64_MAX) {
            /* In this case, it means that the rounding constant is 1,
             * and the addition would overflow. Return the actual
             * result directly.  */
            val = 0x8000000000000000ULL;
        } else {
            val++;
            val >>= 1;
        }
    } else { \
        uint64_t tmp = val;
        val <<= shift;
        if ((val >> shift) != tmp) {
            SET_QC();
            val = ~0;
        }
    }
    return val;
}